

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_move.c
# Opt level: O0

void do_door_bash(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  long *plVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  CClass *this;
  long lVar9;
  long in_RDI;
  __type_conflict2 _Var10;
  AFFECT_DATA af;
  EXIT_DATA *pexit_rev;
  ROOM_INDEX_DATA *to_room;
  EXIT_DATA *pexit;
  int door;
  int chance;
  char arg [4608];
  undefined4 in_stack_ffffffffffffecf8;
  int in_stack_ffffffffffffecfc;
  int in_stack_ffffffffffffed00;
  undefined4 in_stack_ffffffffffffed04;
  undefined4 in_stack_ffffffffffffed08;
  int in_stack_ffffffffffffed0c;
  char_data *in_stack_ffffffffffffed10;
  char *ch_00;
  undefined8 in_stack_ffffffffffffed28;
  CHAR_DATA *in_stack_ffffffffffffed30;
  CHAR_DATA *ch_01;
  CHAR_DATA *in_stack_ffffffffffffed38;
  ulong uVar11;
  undefined8 in_stack_ffffffffffffedd0;
  long *plVar12;
  char local_1218;
  int in_stack_ffffffffffffedfc;
  CHAR_DATA *in_stack_ffffffffffffee00;
  
  iVar8 = (int)((ulong)in_stack_ffffffffffffed28 >> 0x20);
  iVar7 = (int)((ulong)in_stack_ffffffffffffedd0 >> 0x20);
  one_argument((char *)CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00),
               (char *)CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8));
  if (local_1218 == '\0') {
    send_to_char((char *)in_stack_ffffffffffffed10,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08));
    return;
  }
  iVar4 = get_skill(in_stack_ffffffffffffee00,in_stack_ffffffffffffedfc);
  bVar3 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8));
  if (bVar3) {
    iVar4 = 0x32;
  }
  bVar3 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8));
  if (bVar3) {
LAB_005629d3:
    if (*(short *)(in_RDI + 0x162) < 5) {
      send_to_char((char *)in_stack_ffffffffffffed10,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08));
    }
    else {
      iVar5 = find_door(in_stack_ffffffffffffed38,(char *)in_stack_ffffffffffffed30);
      if (-1 < iVar5) {
        plVar12 = *(long **)(*(long *)(in_RDI + 0xa8) + 0x38 + (long)iVar5 * 8);
        uVar11 = plVar12[1];
        _Var10 = std::pow<int,int>(0,0x562a6f);
        if ((uVar11 & (long)_Var10) == 0) {
          send_to_char((char *)in_stack_ffffffffffffed10,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08));
        }
        else {
          uVar11 = plVar12[1];
          _Var10 = std::pow<int,int>(0,0x562ab8);
          if ((uVar11 & (long)_Var10) == 0) {
            uVar11 = plVar12[1];
            _Var10 = std::pow<int,int>(0,0x562aeb);
            if ((uVar11 & (long)_Var10) == 0) {
              send_to_char((char *)in_stack_ffffffffffffed10,
                           (CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08));
              return;
            }
          }
          bVar3 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8))
          ;
          if (!bVar3) {
            iVar4 = (int)*(short *)(in_RDI + 0x1fe) / 10 + iVar4 / 4;
            iVar6 = get_curr_stat(in_stack_ffffffffffffed30,iVar8);
            iVar4 = iVar6 / 2 + iVar4;
          }
          bVar3 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8))
          ;
          if ((!bVar3) &&
             (((bVar3 = str_cmp(pc_race_table[*(short *)(in_RDI + 0x136)].name,"planar"), !bVar3 ||
               (bVar3 = str_cmp(pc_race_table[*(short *)(in_RDI + 0x136)].name,"abyss"), !bVar3)) ||
              (bVar3 = str_cmp(pc_race_table[*(short *)(in_RDI + 0x136)].name,"celestial"), !bVar3))
             )) {
            iVar4 = iVar4 + 0x14;
          }
          bVar3 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8))
          ;
          if ((!bVar3) &&
             (bVar3 = is_immortal((CHAR_DATA *)
                                  CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8)),
             bVar3)) {
            iVar4 = 100;
          }
          do_visible((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00),
                     (char *)CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8));
          iVar6 = number_percent();
          if (iVar6 <= iVar4) {
            ch_01 = (CHAR_DATA *)plVar12[1];
            _Var10 = std::pow<int,int>(0,0x562cc1);
            if (((ulong)ch_01 & (long)_Var10) == 0) {
              act((char *)in_stack_ffffffffffffed10,
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
                  (void *)CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00),
                  (void *)CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8),0);
              act((char *)in_stack_ffffffffffffed10,
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
                  (void *)CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00),
                  (void *)CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8),0);
              check_improve((CHAR_DATA *)CONCAT44(iVar4,iVar5),(int)((ulong)plVar12 >> 0x20),
                            SUB81((ulong)plVar12 >> 0x18,0),iVar7);
              WAIT_STATE(in_stack_ffffffffffffed10,in_stack_ffffffffffffed0c);
              _Var10 = std::pow<int,int>(0,0x562ece);
              plVar12[1] = ((long)_Var10 ^ 0xffffffffffffffffU) & plVar12[1];
              _Var10 = std::pow<int,int>(0,0x562ef6);
              plVar12[1] = ((long)_Var10 ^ 0xffffffffffffffffU) & plVar12[1];
              _Var10 = std::pow<int,int>(0,0x562f1e);
              plVar12[1] = ((long)_Var10 ^ 0xffffffffffffffffU) & plVar12[1];
              plVar2 = *(long **)(*plVar12 + 0x38 + (long)rev_dir[iVar5] * 8);
              if (((*plVar12 != 0) && (plVar2 != (long *)0x0)) &&
                 (*plVar2 == *(long *)(in_RDI + 0xa8))) {
                _Var10 = std::pow<int,int>(0,0x562fb9);
                plVar2[1] = ((long)_Var10 ^ 0xffffffffffffffffU) & plVar2[1];
                _Var10 = std::pow<int,int>(0,0x562fe1);
                plVar2[1] = ((long)_Var10 ^ 0xffffffffffffffffU) & plVar2[1];
                _Var10 = std::pow<int,int>(0,0x563009);
                plVar2[1] = ((long)_Var10 ^ 0xffffffffffffffffU) & plVar2[1];
              }
              iVar7 = number_percent();
              iVar8 = get_curr_stat(ch_01,iVar8);
              if (SBORROW4(iVar7,iVar8 * 3) != iVar7 + iVar8 * -3 < 0) {
                return;
              }
              bVar3 = is_npc((CHAR_DATA *)
                             CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8));
              if (bVar3) {
                return;
              }
              init_affect((AFFECT_DATA *)0x56306c);
              affect_to_char((CHAR_DATA *)
                             CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00),
                             (AFFECT_DATA *)
                             CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8));
              move_char((CHAR_DATA *)arg._816_8_,arg._812_4_,(bool)arg[0x32b],(bool)arg[0x32a]);
              affect_strip(in_stack_ffffffffffffed10,in_stack_ffffffffffffed0c);
              return;
            }
          }
          act((char *)in_stack_ffffffffffffed10,
              (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
              (void *)CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00),
              (void *)CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8),0);
          act((char *)in_stack_ffffffffffffed10,
              (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
              (void *)CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00),
              (void *)CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8),0);
          if (*(long *)(*plVar12 + 0x18) != 0) {
            act((char *)in_stack_ffffffffffffed10,
                (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08),
                (void *)CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00),
                (void *)CONCAT44(in_stack_ffffffffffffecfc,in_stack_ffffffffffffecf8),0);
          }
          dice(in_stack_ffffffffffffed00,in_stack_ffffffffffffecfc);
          ch_00 = "the impact*";
          damage_new((CHAR_DATA *)af._32_8_,(CHAR_DATA *)af._24_8_,af.name._4_4_,(int)af.name,
                     af.owner._4_4_,af.owner._3_1_,af.owner._2_1_,(int)af.tick_fun,(int)af.pulse_fun
                     ,(char *)af.end_fun);
          check_improve((CHAR_DATA *)CONCAT44(iVar4,iVar5),(int)((ulong)plVar12 >> 0x20),
                        SUB81((ulong)plVar12 >> 0x18,0),iVar7);
          *(undefined2 *)(in_RDI + 0x1f8) = 5;
          WAIT_STATE((CHAR_DATA *)ch_00,in_stack_ffffffffffffed0c);
        }
      }
    }
  }
  else {
    if (iVar4 != 0) {
      sVar1 = *(short *)(in_RDI + 0x138);
      lVar9 = (long)gsn_door_bash;
      this = char_data::Class(in_stack_ffffffffffffed10);
      iVar5 = CClass::GetIndex(this);
      if (*(short *)(lVar9 * 0x60 + 0x8daef8 + (long)iVar5 * 2) <= sVar1) goto LAB_005629d3;
    }
    send_to_char((char *)in_stack_ffffffffffffed10,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed0c,in_stack_ffffffffffffed08));
  }
  return;
}

Assistant:

void do_door_bash(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Bash door which door?\n\r", ch);
		return;
	}

	auto chance = get_skill(ch, gsn_door_bash);

	if (is_npc(ch))
		chance = 50;

	if (!is_npc(ch) && (chance == 0 || ch->level < skill_table[gsn_door_bash].skill_level[ch->Class()->GetIndex()]))
	{
		send_to_char("You'd hurt yourself doing that.\n\r", ch);
		return;
	}

	if (ch->move < 5)
	{
		send_to_char("You are too exhausted.\n\r", ch);
		return;
	}

	auto door = find_door(ch, arg);
	if (door < 0)
		return;

	auto pexit = ch->in_room->exit[door];
	if (!IS_SET(pexit->exit_info, EX_CLOSED))
	{
		send_to_char("It's not closed.\n\r", ch);
		return;
	}

	if (!IS_SET(pexit->exit_info, EX_LOCKED) && !IS_SET(pexit->exit_info, EX_JAMMED))
	{
		send_to_char("It's already unlocked, why not just use the knob?\n\r", ch);
		return;
	}

	if (!is_npc(ch))
	{
		chance /= 4;
		chance += ch->carry_weight / 10;
		chance += get_curr_stat(ch, STAT_STR) / 2;
	}

	if (!is_npc(ch))
	{
		if (!str_cmp(pc_race_table[ch->race].name, "planar")
			|| !str_cmp(pc_race_table[ch->race].name, "abyss")
			|| !str_cmp(pc_race_table[ch->race].name, "celestial"))
		{
			chance += 20;
		}
	}

	if (!is_npc(ch) && is_immortal(ch))
		chance = 100;

	do_visible(ch, "");

	if (number_percent() > chance || IS_SET(pexit->exit_info, EX_NOBASH))
	{
		act("$n flies into the $T door and rebounds with a great lack of dignity!", ch, 0, dir_name[door], TO_ROOM);
		act("You fly into the door $T but simply bounce off it like a lump of rock!", ch, 0, dir_name[door], TO_CHAR);

		if (pexit->u1.to_room->people)
			act("The door buckles as a heavy weight crashes against it from the other side!", pexit->u1.to_room->people, 0, 0, TO_ALL);

		damage_new(ch, ch, dice(ch->level, 2), gsn_door_bash, DAM_BASH, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the impact*");

		check_improve(ch, gsn_door_bash, false, 1);

		ch->position = POS_RESTING;

		WAIT_STATE(ch, 3 * PULSE_VIOLENCE);
		return;
	}

	act("$n slams into the $T door and throws it open with a mighty crash!", ch, 0, dir_name[door], TO_ROOM);
	act("You slam into the $T door and it cracks open with a deafening sound!", ch, 0, dir_name[door], TO_CHAR);

	check_improve(ch, gsn_door_bash, true, 1);

	WAIT_STATE(ch, 2 * PULSE_VIOLENCE);
	REMOVE_BIT(pexit->exit_info, EX_LOCKED);
	REMOVE_BIT(pexit->exit_info, EX_CLOSED);
	REMOVE_BIT(pexit->exit_info, EX_JAMMED);

	auto to_room = pexit->u1.to_room;
	auto pexit_rev = to_room->exit[rev_dir[door]];

	if (to_room != nullptr && pexit_rev != nullptr && pexit_rev->u1.to_room == ch->in_room)
	{
		REMOVE_BIT(pexit_rev->exit_info, EX_LOCKED);
		REMOVE_BIT(pexit_rev->exit_info, EX_CLOSED);
		REMOVE_BIT(pexit_rev->exit_info, EX_JAMMED);
	}

	if (number_percent() < (3 * get_curr_stat(ch, STAT_DEX)) || is_npc(ch))
		return;

	/*
	* Affect to char so in move_char you relay the right move message, then
	*  strip affect once moved.
	*/
	AFFECT_DATA af;
	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SKILL;
	af.type = gsn_door_bash;
	af.location = 0;
	af.modifier = 0;
	af.duration = -1;
	af.level = ch->level;
	affect_to_char(ch, &af);

	move_char(ch, door, false, true);
	affect_strip(ch, gsn_door_bash);
}